

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrderManager.hpp
# Opt level: O3

void __thiscall
sjtu::OrderManager::buy_ticket
          (OrderManager *this,UserManager *user_manager,TrainManager *train_manager,int argc,
          string *argv)

{
  string *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  char *pcVar4;
  BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>
  *this_00;
  bool bVar5;
  int iVar6;
  int *piVar7;
  orderType *order;
  long *plVar8;
  size_t sVar9;
  undefined8 uVar10;
  long lVar11;
  string *psVar12;
  ulong uVar13;
  string *psVar14;
  long lVar15;
  int iVar16;
  bool bVar17;
  string uname;
  string uto;
  string ufrom;
  string utrain;
  timeType uday;
  char *local_160;
  char *local_148;
  long local_140;
  char local_138;
  undefined7 uStack_137;
  char *local_128;
  undefined8 local_120;
  char local_118;
  undefined7 uStack_117;
  char *local_108;
  undefined8 local_100;
  char local_f8;
  undefined7 uStack_f7;
  char *local_e8;
  undefined8 local_e0;
  char local_d8;
  undefined7 uStack_d7;
  TrainManager *local_c8;
  long *local_c0;
  long local_b8;
  long local_b0 [2];
  string local_a0;
  string local_80;
  value_type local_60;
  char *local_48;
  undefined8 uStack_40;
  
  local_148 = &local_138;
  iVar16 = 0;
  local_140 = 0;
  local_138 = '\0';
  local_e8 = &local_d8;
  local_e0 = 0;
  local_d8 = '\0';
  local_108 = &local_f8;
  local_100 = 0;
  local_f8 = '\0';
  local_160 = &local_118;
  local_120 = 0;
  local_118 = '\0';
  local_48 = (char *)0x0;
  uStack_40 = 0;
  local_128 = local_160;
  local_c8 = train_manager;
  if (argc < 1) {
    bVar17 = true;
  }
  else {
    paVar2 = &local_80.field_2;
    psVar12 = argv + 1;
    bVar17 = false;
    do {
      psVar1 = psVar12 + -1;
      iVar6 = std::__cxx11::string::compare((char *)psVar1);
      psVar14 = (string *)&local_148;
      if (iVar6 == 0) {
LAB_001099aa:
        std::__cxx11::string::_M_assign(psVar14);
      }
      else {
        iVar6 = std::__cxx11::string::compare((char *)psVar1);
        psVar14 = (string *)&local_e8;
        if (iVar6 == 0) goto LAB_001099aa;
        iVar6 = std::__cxx11::string::compare((char *)psVar1);
        if (iVar6 == 0) {
          pcVar3 = (psVar12->_M_dataplus)._M_p;
          local_80._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_80,pcVar3,pcVar3 + psVar12->_M_string_length);
          timeType::timeType((timeType *)&local_60,&local_80);
          local_48 = (char *)local_60.first.first;
          uStack_40 = CONCAT44(local_60.first._12_4_,local_60.first.second);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != paVar2) {
            operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          iVar6 = std::__cxx11::string::compare((char *)psVar1);
          if (iVar6 != 0) {
            iVar6 = std::__cxx11::string::compare((char *)psVar1);
            psVar14 = (string *)&local_108;
            if (iVar6 != 0) {
              iVar6 = std::__cxx11::string::compare((char *)psVar1);
              psVar14 = (string *)&local_128;
              if (iVar6 != 0) {
                iVar6 = std::__cxx11::string::compare((char *)psVar1);
                if (iVar6 == 0) {
                  iVar6 = std::__cxx11::string::compare((char *)psVar12);
                  bVar17 = iVar6 == 0;
                }
                goto LAB_001099b2;
              }
            }
            goto LAB_001099aa;
          }
          pcVar4 = (psVar12->_M_dataplus)._M_p;
          piVar7 = __errno_location();
          iVar6 = *piVar7;
          *piVar7 = 0;
          local_160 = (char *)strtol(pcVar4,(char **)&local_60,10);
          if ((char *)local_60.first.first == pcVar4) {
LAB_00109ed1:
            uVar10 = std::__throw_invalid_argument("stoi");
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c0 != paVar2) {
              operator_delete(local_c0,local_b0[0] + 1);
            }
            if (local_128 != &local_118) {
              operator_delete(local_128,CONCAT71(uStack_117,local_118) + 1);
            }
            if (local_108 != &local_f8) {
              operator_delete(local_108,CONCAT71(uStack_f7,local_f8) + 1);
            }
            if (local_e8 != &local_d8) {
              operator_delete(local_e8,CONCAT71(uStack_d7,local_d8) + 1);
            }
            if (local_148 != &local_138) {
              operator_delete(local_148,CONCAT71(uStack_137,local_138) + 1);
            }
            _Unwind_Resume(uVar10);
          }
          if (((char *)(long)(int)local_160 != local_160) || (*piVar7 == 0x22)) {
            std::__throw_out_of_range("stoi");
            goto LAB_00109ed1;
          }
          if (*piVar7 == 0) {
            *piVar7 = iVar6;
          }
        }
      }
LAB_001099b2:
      psVar12 = psVar12 + 2;
      iVar16 = iVar16 + 2;
    } while (iVar16 < argc);
    bVar17 = !bVar17;
  }
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_a0,local_148,local_148 + local_140);
  bVar5 = UserManager::is_login(user_manager,&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if (bVar5) {
    order = (orderType *)operator_new(0xb8);
    order->date[1].month = 0;
    order->date[1].day = 0;
    order->date[1].hour = 0;
    order->date[1].minute = 0;
    order->date[0].month = 0;
    order->date[0].day = 0;
    order->date[0].hour = 0;
    order->date[0].minute = 0;
    strcpy((char *)order,local_148);
    pcVar4 = order->trainID;
    strcpy(pcVar4,local_e8);
    strcpy(order->station[0],local_108);
    strcpy(order->station[1],local_128);
    order->num = (int)local_160;
    *(char **)order->date = local_48;
    order->date[0].hour = (undefined4)uStack_40;
    order->date[0].minute = uStack_40._4_4_;
    bVar5 = TrainManager::buy_ticket(local_c8,order);
    if (bVar5) {
      if (order->status == success) {
        UserManager::add_order(user_manager,this,order);
        plVar8 = (long *)std::ostream::operator<<((ostream *)&std::cout,order->num * order->price);
        std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
      }
      else if (bVar17) {
        plVar8 = (long *)std::ostream::operator<<((ostream *)&std::cout,-1);
        std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
      }
      else {
        order->status = pending;
        UserManager::add_order(user_manager,this,order);
        this_00 = this->PendingBpTree;
        local_c0 = local_b0;
        sVar9 = strlen(pcVar4);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,pcVar4,pcVar4 + sVar9);
        if (local_b8 == 0) {
          local_60.first.first = 0;
        }
        else {
          lVar15 = 0;
          lVar11 = 0;
          uVar13 = 0;
          do {
            lVar11 = ((long)*(char *)((long)local_c0 + lVar15) + lVar11 * 0x239 + 0x100) %
                     0x3b800001;
            uVar13 = (long)((long)*(char *)((long)local_c0 + lVar15) + uVar13 * 0x301 + 0x100) %
                     0x3b9aca07;
            lVar15 = lVar15 + 1;
          } while (local_b8 != lVar15);
          local_60.first.first = lVar11 << 0x20 | uVar13;
        }
        local_60.first.second = this->pending_id + 1;
        this->pending_id = local_60.first.second;
        local_60.second = order->offset;
        BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>
        ::insert(this_00,&local_60);
        if (local_c0 != local_b0) {
          operator_delete(local_c0,local_b0[0] + 1);
        }
        plVar8 = &std::cout;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"queue",5);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
      }
    }
    else {
      plVar8 = (long *)std::ostream::operator<<((ostream *)&std::cout,-1);
      std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
    }
    std::ostream::put((char)plVar8);
    std::ostream::flush();
    operator_delete(order,0xb8);
  }
  else {
    plVar8 = (long *)std::ostream::operator<<((ostream *)&std::cout,-1);
    std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
    std::ostream::put((char)plVar8);
    std::ostream::flush();
  }
  if (local_128 != &local_118) {
    operator_delete(local_128,CONCAT71(uStack_117,local_118) + 1);
  }
  if (local_108 != &local_f8) {
    operator_delete(local_108,CONCAT71(uStack_f7,local_f8) + 1);
  }
  if (local_e8 != &local_d8) {
    operator_delete(local_e8,CONCAT71(uStack_d7,local_d8) + 1);
  }
  if (local_148 != &local_138) {
    operator_delete(local_148,CONCAT71(uStack_137,local_138) + 1);
  }
  return;
}

Assistant:

void buy_ticket(UserManager *user_manager, TrainManager *train_manager, int argc, std::string *argv) {
            std::string uname, utrain, ufrom, uto;timeType uday;
            int unum;
            bool ifpending = false;
            for (int i = 0; i < argc; i += 2) {
                if (argv[i] == "-u") uname = argv[i + 1];
                else if (argv[i] == "-i") utrain = argv[i + 1];
                else if (argv[i] == "-d") uday = timeType(argv[i + 1]);
                else if (argv[i] == "-n") unum = stoi(argv[i + 1]);
                else if (argv[i] == "-f") ufrom = argv[i + 1];
                else if (argv[i] == "-t") uto = argv[i + 1];
                else if (argv[i] == "-q") {
                    if (argv[i + 1] == "true") ifpending = true;
                    else ifpending = false;
                }
            }
            if (user_manager->is_login(uname) == false) std::cout << -1 << std::endl;
            else {
                orderType *tmp = new orderType;
                strcpy(tmp->username, uname.c_str());
                strcpy(tmp->trainID, utrain.c_str());
                strcpy(tmp->station[0], ufrom.c_str());
                strcpy(tmp->station[1], uto.c_str());
                tmp -> num = unum;
                tmp->date[0] = uday;
                if (train_manager->buy_ticket(tmp) == false) std::cout << -1 << std::endl;
                else {
                    if (tmp->status == success) {
                        user_manager->add_order(this, tmp);
                        std::cout << tmp->price * tmp->num << std::endl;
                    }
                    else {
                        if (ifpending == false) std::cout << -1 << std::endl;
                        else {
                            tmp->status = pending;
                            user_manager->add_order(this, tmp);
                            PendingBpTree->insert(std::make_pair(std::make_pair(hasher(tmp->trainID), ++ pending_id), tmp->offset));
                            std::cout << "queue" << std::endl;
                        }
                    }
                }
                delete tmp;
            }
        }